

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmyblas2.c
# Opt level: O2

void dmatvec(int ldm,int nrow,int ncol,double *M,double *vec,double *Mxvec)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  ulong uVar9;
  ulong uVar10;
  double *pdVar11;
  double *pdVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  bool bVar17;
  
  lVar14 = (long)ldm;
  uVar9 = 0;
  uVar16 = (ulong)(uint)nrow;
  if (nrow < 1) {
    uVar16 = uVar9;
  }
  pdVar11 = M;
  for (lVar13 = 0; lVar13 < ncol + -7; lVar13 = lVar13 + 8) {
    dVar1 = vec[lVar13];
    dVar2 = vec[lVar13 + 1];
    dVar3 = vec[lVar13 + 2];
    dVar4 = vec[lVar13 + 3];
    dVar5 = vec[lVar13 + 4];
    dVar6 = vec[lVar13 + 5];
    dVar7 = vec[lVar13 + 6];
    dVar8 = vec[lVar13 + 7];
    for (uVar15 = 0; uVar16 != uVar15; uVar15 = uVar15 + 1) {
      pdVar12 = pdVar11 + uVar15;
      Mxvec[uVar15] =
           pdVar12[lVar14 * 7] * dVar8 +
           pdVar12[lVar14 * 6] * dVar7 +
           pdVar12[lVar14 * 5] * dVar6 +
           pdVar12[lVar14 * 4] * dVar5 +
           pdVar12[lVar14 * 3] * dVar4 +
           pdVar12[lVar14 * 2] * dVar3 + *pdVar12 * dVar1 + pdVar12[lVar14] * dVar2 + Mxvec[uVar15];
    }
    pdVar11 = pdVar11 + ldm * 8;
    uVar9 = uVar9 + (long)(ldm * 8) * 8;
  }
  for (; lVar13 < ncol + -3; lVar13 = lVar13 + 4) {
    dVar1 = vec[lVar13];
    dVar2 = vec[lVar13 + 1];
    dVar3 = vec[lVar13 + 2];
    dVar4 = vec[lVar13 + 3];
    uVar15 = uVar9;
    uVar10 = uVar16;
    pdVar12 = Mxvec;
    while (bVar17 = uVar10 != 0, uVar10 = uVar10 - 1, bVar17) {
      *pdVar12 = *(double *)((long)M + uVar15 + lVar14 * 0x18) * dVar4 +
                 *(double *)((long)M + uVar15 + lVar14 * 0x10) * dVar3 +
                 *(double *)((long)M + uVar15) * dVar1 +
                 *(double *)((long)M + uVar15 + lVar14 * 8) * dVar2 + *pdVar12;
      pdVar12 = pdVar12 + 1;
      uVar15 = uVar15 + 8;
    }
    pdVar11 = pdVar11 + ldm * 4;
    uVar9 = uVar9 + (long)(ldm * 4) * 8;
  }
  for (; lVar13 < ncol; lVar13 = lVar13 + 1) {
    dVar1 = vec[lVar13];
    for (uVar9 = 0; uVar16 != uVar9; uVar9 = uVar9 + 1) {
      Mxvec[uVar9] = pdVar11[uVar9] * dVar1 + Mxvec[uVar9];
    }
    pdVar11 = pdVar11 + lVar14;
  }
  return;
}

Assistant:

void dmatvec (int ldm, int nrow, int ncol, double *M, double *vec, double *Mxvec)
{
    double vi0, vi1, vi2, vi3, vi4, vi5, vi6, vi7;
    double *M0;
    register double *Mki0, *Mki1, *Mki2, *Mki3, *Mki4, *Mki5, *Mki6, *Mki7;
    register int firstcol = 0;
    int k;

    M0 = &M[0];
    while ( firstcol < ncol - 7 ) {	/* Do 8 columns */

	Mki0 = M0;
	Mki1 = Mki0 + ldm;
        Mki2 = Mki1 + ldm;
        Mki3 = Mki2 + ldm;
	Mki4 = Mki3 + ldm;
	Mki5 = Mki4 + ldm;
	Mki6 = Mki5 + ldm;
	Mki7 = Mki6 + ldm;

	vi0 = vec[firstcol++];
	vi1 = vec[firstcol++];
	vi2 = vec[firstcol++];
	vi3 = vec[firstcol++];	
	vi4 = vec[firstcol++];
	vi5 = vec[firstcol++];
	vi6 = vec[firstcol++];
	vi7 = vec[firstcol++];	

	for (k = 0; k < nrow; k++) 
	    Mxvec[k] += vi0 * *Mki0++ + vi1 * *Mki1++
		      + vi2 * *Mki2++ + vi3 * *Mki3++ 
		      + vi4 * *Mki4++ + vi5 * *Mki5++
		      + vi6 * *Mki6++ + vi7 * *Mki7++;

	M0 += 8 * ldm;
    }

    while ( firstcol < ncol - 3 ) {	/* Do 4 columns */

	Mki0 = M0;
	Mki1 = Mki0 + ldm;
	Mki2 = Mki1 + ldm;
	Mki3 = Mki2 + ldm;

	vi0 = vec[firstcol++];
	vi1 = vec[firstcol++];
	vi2 = vec[firstcol++];
	vi3 = vec[firstcol++];	
	for (k = 0; k < nrow; k++) 
	    Mxvec[k] += vi0 * *Mki0++ + vi1 * *Mki1++
		      + vi2 * *Mki2++ + vi3 * *Mki3++ ;

	M0 += 4 * ldm;
    }

    while ( firstcol < ncol ) {		/* Do 1 column */

 	Mki0 = M0;
	vi0 = vec[firstcol++];
	for (k = 0; k < nrow; k++)
	    Mxvec[k] += vi0 * *Mki0++;

	M0 += ldm;
    }
	
}